

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O1

int __thiscall
Ptex::v2_2::PtexWriterBase::writeMetaDataBlock(PtexWriterBase *this,FILE *fp,MetaEntry *val)

{
  undefined2 in_AX;
  uint8_t datatype;
  uint8_t keysize;
  uint32_t datasize;
  undefined4 uStack_38;
  int local_34;
  
  uStack_38._0_3_ = CONCAT12((char)val->datatype,in_AX);
  _uStack_38 = CONCAT44(*(int *)&(val->data).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                        *(int *)&(val->data).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                        CONCAT13((char)(val->key)._M_string_length + '\x01',(undefined3)uStack_38));
  writeZipBlock(this,fp,(void *)((long)&uStack_38 + 3),1,false);
  writeZipBlock(this,fp,(val->key)._M_dataplus._M_p,(uint)uStack_38._3_1_,false);
  writeZipBlock(this,fp,(void *)((long)&uStack_38 + 2),1,false);
  writeZipBlock(this,fp,&local_34,4,false);
  writeZipBlock(this,fp,(val->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,local_34,false);
  return (uint)uStack_38._3_1_ + local_34 + 6;
}

Assistant:

int PtexWriterBase::writeMetaDataBlock(FILE* fp, MetaEntry& val)
{
    uint8_t keysize = uint8_t(val.key.size()+1);
    uint8_t datatype = val.datatype;
    uint32_t datasize = uint32_t(val.data.size());
    writeZipBlock(fp, &keysize, sizeof(keysize), false);
    writeZipBlock(fp, val.key.c_str(), keysize, false);
    writeZipBlock(fp, &datatype, sizeof(datatype), false);
    writeZipBlock(fp, &datasize, sizeof(datasize), false);
    writeZipBlock(fp, &val.data[0], datasize, false);
    int memsize = int(sizeof(keysize) + (size_t)keysize + sizeof(datatype)
                   + sizeof(datasize) + datasize);
    return memsize;
}